

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

HostAccessProtocol adios2::helper::GetHostAccessProtocol(string *valueStr)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  char *in_RDI;
  _func_int_int *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  _Var2._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  _Var2 = std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                    (_Var2,__last,__result,in_stack_ffffffffffffffd0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          _Var2._M_current,in_RDI);
  if (bVar1) {
    local_4 = SSH;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            _Var2._M_current,in_RDI);
    if (bVar1) {
      local_4 = S3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _Var2._M_current,in_RDI);
      if (bVar1) {
        local_4 = XRootD;
      }
      else {
        local_4 = Invalid;
      }
    }
  }
  return local_4;
}

Assistant:

HostAccessProtocol GetHostAccessProtocol(std::string valueStr)
{
    std::transform(valueStr.begin(), valueStr.end(), valueStr.begin(), ::tolower);
    if (valueStr == "ssh")
    {
        return HostAccessProtocol::SSH;
    }
    else if (valueStr == "s3")
    {
        return HostAccessProtocol::S3;
    }
    else if (valueStr == "xrootd")
    {
        return HostAccessProtocol::XRootD;
    }
    return HostAccessProtocol::Invalid;
}